

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

ON_Mesh * __thiscall ON_PlaneSurface::CreateMesh(ON_PlaneSurface *this,ON_Mesh *mesh)

{
  ON_Plane *this_00;
  ON_3dPointArray *this_01;
  undefined1 *this_02;
  undefined1 *this_03;
  ON_3fVectorArray *this_04;
  ON_2dPointArray *this_05;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON_3dVector *pOVar5;
  double dVar6;
  double dVar7;
  ON_MeshFace mf;
  undefined1 local_50 [8];
  float local_48;
  int local_44;
  double local_38;
  
  this_00 = &this->m_plane;
  bVar1 = ON_Plane::IsValid(this_00);
  if (bVar1) {
    this_02 = &this->field_0x90;
    bVar1 = ON_Interval::IsValid((ON_Interval *)this_02);
    if (bVar1) {
      this_03 = &this->field_0xa0;
      bVar1 = ON_Interval::IsValid((ON_Interval *)this_03);
      if (bVar1) {
        if (mesh == (ON_Mesh *)0x0) {
          mesh = (ON_Mesh *)operator_new(0x6e0);
          ON_Mesh::ON_Mesh(mesh);
          bVar2 = false;
          bVar1 = false;
        }
        else {
          bVar1 = ON_Mesh::HasDoublePrecisionVertices(mesh);
          if (!bVar1) {
            ON_Mesh::UpdateDoublePrecisionVertices(mesh);
          }
          bVar1 = ON_Mesh::HasVertexNormals(mesh);
          bVar2 = ON_Mesh::HasFaceNormals(mesh);
          bVar3 = ON_Mesh::HasMeshTopology(mesh);
          if (bVar3) {
            ON_Mesh::DestroyTopology(mesh);
          }
        }
        this_01 = &mesh->m_dV;
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,0);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,0);
        ON_Surface::PointAt((ON_3dPoint *)local_50,&this->super_ON_Surface,dVar6,dVar7);
        ON_SimpleArray<ON_3dPoint>::Append
                  (&this_01->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)local_50);
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,1);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,0);
        ON_Surface::PointAt((ON_3dPoint *)local_50,&this->super_ON_Surface,dVar6,dVar7);
        ON_SimpleArray<ON_3dPoint>::Append
                  (&this_01->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)local_50);
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,1);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,1);
        ON_Surface::PointAt((ON_3dPoint *)local_50,&this->super_ON_Surface,dVar6,dVar7);
        ON_SimpleArray<ON_3dPoint>::Append
                  (&this_01->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)local_50);
        local_38 = ON_Interval::operator[]((ON_Interval *)this_02,0);
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_03,1);
        ON_Surface::PointAt((ON_3dPoint *)local_50,&this->super_ON_Surface,local_38,dVar6);
        ON_SimpleArray<ON_3dPoint>::Append
                  (&this_01->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)local_50);
        ON_Mesh::UpdateSinglePrecisionVertices(mesh);
        iVar4 = ON_Mesh::VertexCount(mesh);
        local_50._0_4_ = iVar4 + -4;
        iVar4 = ON_Mesh::VertexCount(mesh);
        local_50._4_4_ = iVar4 + -3;
        iVar4 = ON_Mesh::VertexCount(mesh);
        local_48 = (float)(iVar4 + -2);
        local_44 = ON_Mesh::VertexCount(mesh);
        local_44 = local_44 + -1;
        ON_SimpleArray<ON_MeshFace>::Append(&mesh->m_F,(ON_MeshFace *)local_50);
        if (bVar1 != false) {
          this_04 = &mesh->m_N;
          pOVar5 = ON_Plane::Normal(this_00);
          ON_3fVector::ON_3fVector((ON_3fVector *)local_50,pOVar5);
          ON_SimpleArray<ON_3fVector>::Append
                    (&this_04->super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_50);
          pOVar5 = ON_Plane::Normal(this_00);
          ON_3fVector::ON_3fVector((ON_3fVector *)local_50,pOVar5);
          ON_SimpleArray<ON_3fVector>::Append
                    (&this_04->super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_50);
          pOVar5 = ON_Plane::Normal(this_00);
          ON_3fVector::ON_3fVector((ON_3fVector *)local_50,pOVar5);
          ON_SimpleArray<ON_3fVector>::Append
                    (&this_04->super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_50);
          pOVar5 = ON_Plane::Normal(this_00);
          ON_3fVector::ON_3fVector((ON_3fVector *)local_50,pOVar5);
          ON_SimpleArray<ON_3fVector>::Append
                    (&this_04->super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_50);
        }
        if (bVar2 != false) {
          pOVar5 = ON_Plane::Normal(this_00);
          ON_3fVector::ON_3fVector((ON_3fVector *)local_50,pOVar5);
          ON_SimpleArray<ON_3fVector>::Append
                    (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_50);
        }
        this_05 = &mesh->m_S;
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,0);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,0);
        ON_2dPoint::ON_2dPoint((ON_2dPoint *)local_50,dVar6,dVar7);
        ON_SimpleArray<ON_2dPoint>::Append
                  (&this_05->super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)local_50);
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,1);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,0);
        ON_2dPoint::ON_2dPoint((ON_2dPoint *)local_50,dVar6,dVar7);
        ON_SimpleArray<ON_2dPoint>::Append
                  (&this_05->super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)local_50);
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,1);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,1);
        ON_2dPoint::ON_2dPoint((ON_2dPoint *)local_50,dVar6,dVar7);
        ON_SimpleArray<ON_2dPoint>::Append
                  (&this_05->super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)local_50);
        dVar6 = ON_Interval::operator[]((ON_Interval *)this_02,0);
        dVar7 = ON_Interval::operator[]((ON_Interval *)this_03,1);
        ON_2dPoint::ON_2dPoint((ON_2dPoint *)local_50,dVar6,dVar7);
        ON_SimpleArray<ON_2dPoint>::Append
                  (&this_05->super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)local_50);
        return mesh;
      }
    }
  }
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_PlaneSurface::CreateMesh(
  ON_Mesh* mesh
) const
{
  ON_Mesh* rc = nullptr;

  if (m_plane.IsValid() && m_domain[0].IsValid() && m_domain[1].IsValid())
  {
    bool vn = false, fn = false, sp = true;

    if (mesh == nullptr) mesh = new ON_Mesh();
    else
    {
      if (!mesh->HasDoublePrecisionVertices()) mesh->UpdateDoublePrecisionVertices();
      if (mesh->HasVertexNormals()) vn = true;
      if (mesh->HasFaceNormals()) fn = true;
      if (mesh->HasMeshTopology()) mesh->DestroyTopology();
    }

    mesh->m_dV.Append(PointAt(m_domain[0][0], m_domain[1][0]));
    mesh->m_dV.Append(PointAt(m_domain[0][1], m_domain[1][0]));
    mesh->m_dV.Append(PointAt(m_domain[0][1], m_domain[1][1]));
    mesh->m_dV.Append(PointAt(m_domain[0][0], m_domain[1][1]));
    mesh->UpdateSinglePrecisionVertices();

    {
      ON_MeshFace mf;
      mf.vi[0] = mesh->VertexCount() - 4;
      mf.vi[1] = mesh->VertexCount() - 3;
      mf.vi[2] = mesh->VertexCount() - 2;
      mf.vi[3] = mesh->VertexCount() - 1;
      mesh->m_F.Append(mf);
    }

    if (vn)
    {
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
    }

    if (fn)
    {
      mesh->m_FN.Append((ON_3fVector)m_plane.Normal());
    }

    if (sp)
    {
      mesh->m_S.Append(ON_2dPoint(m_domain[0][0], m_domain[1][0]));
      mesh->m_S.Append(ON_2dPoint(m_domain[0][1], m_domain[1][0]));
      mesh->m_S.Append(ON_2dPoint(m_domain[0][1], m_domain[1][1]));
      mesh->m_S.Append(ON_2dPoint(m_domain[0][0], m_domain[1][1]));
    }

    rc = mesh;
  }
  return rc;
}